

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isCompleted(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int index)

{
  iterator iVar1;
  key_type_conflict1 local_24;
  
  std::mutex::lock(&this->promiseLock);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(this->usedPromiseByInteger)._M_t,&local_24);
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return (_Rb_tree_header *)iVar1._M_node !=
         &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool isCompleted(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        return (fnd != usedPromiseByInteger.end());
    }